

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_write_u64(mpack_writer_t *writer,uint64_t value)

{
  char *pcVar1;
  _Bool _Var2;
  uint8_t *u;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  if (value < 0x80) {
    if ((writer->end == writer->current) && (_Var2 = mpack_writer_ensure(writer,1), !_Var2)) {
      return;
    }
    *writer->current = (char)value;
    lVar3 = 1;
  }
  else if (value < 0x100) {
    if (((ulong)((long)writer->end - (long)writer->current) < 2) &&
       (_Var2 = mpack_writer_ensure(writer,2), !_Var2)) {
      return;
    }
    pcVar1 = writer->current;
    *pcVar1 = -0x34;
    pcVar1[1] = (char)value;
    lVar3 = 2;
  }
  else if (value < 0x10000) {
    if (((ulong)((long)writer->end - (long)writer->current) < 3) &&
       (_Var2 = mpack_writer_ensure(writer,3), !_Var2)) {
      return;
    }
    pcVar1 = writer->current;
    *pcVar1 = -0x33;
    *(ushort *)(pcVar1 + 1) = (ushort)value << 8 | (ushort)value >> 8;
    lVar3 = 3;
  }
  else {
    uVar4 = (long)writer->end - (long)writer->current;
    if (value >> 0x20 == 0) {
      if ((uVar4 < 5) && (_Var2 = mpack_writer_ensure(writer,5), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x32;
      uVar5 = (uint)value;
      *(uint *)(pcVar1 + 1) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      lVar3 = 5;
    }
    else {
      if ((uVar4 < 9) && (_Var2 = mpack_writer_ensure(writer,9), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x31;
      *(uint64_t *)(pcVar1 + 1) =
           value >> 0x38 | (value & 0xff000000000000) >> 0x28 | (value & 0xff0000000000) >> 0x18 |
           (value & 0xff00000000) >> 8 | (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
           (value & 0xff00) << 0x28 | value << 0x38;
      lVar3 = 9;
    }
  }
  writer->current = writer->current + lVar3;
  return;
}

Assistant:

void mpack_write_u64(mpack_writer_t* writer, uint64_t value) {
    mpack_writer_track_element(writer);

    if (value <= 127) {
        MPACK_WRITE_ENCODED(mpack_encode_fixuint, MPACK_TAG_SIZE_FIXUINT, (uint8_t)value);
    } else if (value <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, (uint8_t)value);
    } else if (value <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u16, MPACK_TAG_SIZE_U16, (uint16_t)value);
    } else if (value <= UINT32_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u32, MPACK_TAG_SIZE_U32, (uint32_t)value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_u64, MPACK_TAG_SIZE_U64, value);
    }
}